

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service_base.hpp
# Opt level: O2

void __thiscall
asio::detail::reactive_socket_service_base::
start_connect_op<asio::detail::reactive_socket_connect_op<std::function<void(std::error_code_const&)>,asio::any_io_executor>>
          (reactive_socket_service_base *this,base_implementation_type *impl,
          reactive_socket_connect_op<std::function<void_(const_std::error_code_&)>,_asio::any_io_executor>
          *op,bool is_continuation,void *addr,size_t addrlen,void *param_6,
          enable_if_t<is_same<typename_associated_immediate_executor<typename_reactive_socket_connect_op<function<void_(const_error_code_&)>,_any_io_executor>::handler_type,_typename_reactive_socket_connect_op<function<void_(const_error_code_&)>,_any_io_executor>::io_executor_type>::asio_associated_immediate_executor_is_unspecialised,_void>::value>
          *param_7)

{
  do_start_connect_op(this,impl,(reactor_op *)op,is_continuation,addr,addrlen,
                      epoll_reactor::call_post_immediate_completion,this->reactor_);
  return;
}

Assistant:

void start_connect_op(base_implementation_type& impl, Op* op,
      bool is_continuation, const void* addr, size_t addrlen, const void*,
      enable_if_t<
        is_same<
          typename associated_immediate_executor<
            typename Op::handler_type,
            typename Op::io_executor_type
          >::asio_associated_immediate_executor_is_unspecialised,
          void
        >::value
      >*)
  {
    return do_start_connect_op(impl, op, is_continuation, addr,
        addrlen, &reactor::call_post_immediate_completion, &reactor_);
  }